

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall Times<0,_0,_0>::propagate(Times<0,_0,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int64_t m_v;
  long lVar14;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  iVar8 = (pIVar1->min).v;
  iVar7 = (pIVar1->max).v;
  lVar12 = (long)iVar7;
  iVar6 = (pIVar2->min).v;
  iVar5 = (pIVar2->max).v;
  lVar13 = (long)iVar5;
  pIVar2 = (this->z).var;
  lVar11 = (long)(pIVar2->min).v;
  lVar9 = (long)(pIVar2->max).v;
  lVar14 = (long)iVar6 * (long)iVar8;
  if (lVar14 - lVar11 != 0 && lVar11 <= lVar14) {
    if (so.lazy) {
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar10 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar1 = (this->z).var;
    iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar14,uVar10,1);
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  lVar14 = lVar13 * lVar12;
  if ((lVar14 < 500000000) && (lVar14 < (((this->z).var)->max).v)) {
    if (so.lazy == true) {
      iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar10 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar1 = (this->z).var;
    iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar14,uVar10,1);
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  if ((0 < iVar5) && (lVar13 = (lVar13 + lVar11 + -1) / lVar13, (((this->x).var)->min).v < lVar13))
  {
    if (so.lazy == true) {
      iVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar10 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar1 = (this->x).var;
    iVar5 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar13,uVar10,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  if ((0 < iVar6) && (lVar13 = lVar9 / (long)iVar6, lVar13 < (((this->x).var)->max).v)) {
    if (so.lazy == true) {
      iVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar10 = (ulong)uVar4 << 0x20 | (long)iVar6 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar1 = (this->x).var;
    iVar6 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar13,uVar10,1);
    if ((char)iVar6 == '\0') {
      return false;
    }
  }
  if ((0 < iVar7) && (lVar12 = (lVar12 + -1 + lVar11) / lVar12, (((this->y).var)->min).v < lVar12))
  {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar10 = (ulong)uVar4 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar1 = (this->y).var;
    iVar7 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar12,uVar10,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  if (iVar8 < 1) {
    return true;
  }
  lVar9 = lVar9 / (long)iVar8;
  if (lVar9 < (((this->y).var)->max).v) {
    if (so.lazy == true) {
      iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar10 = (ulong)uVar4 << 0x20 | (long)iVar8 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar1 = (this->y).var;
    iVar8 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar9,uVar10,1);
    if ((char)iVar8 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= x.min * y.min
		setDom(z, setMin, x_min * y_min, x.getMinLit(), y.getMinLit());
		// z <= x.max * y.max
		if (x_max * y_max < IntVar::max_limit) {
			setDom(z, setMax, x_max * y_max, x.getMaxLit(), y.getMaxLit());
		}

		// x >= ceil(z.min / y.max)
		if (y_max >= 1) {
			setDom(x, setMin, (z_min + y_max - 1) / y_max, y.getMaxLit(), z.getMinLit());
		}

		// x <= floor(z.max / y.min)
		if (y_min >= 1) {
			setDom(x, setMax, z_max / y_min, y.getMinLit(), z.getMaxLit());
		}

		// y >= ceil(z.min / x.max)
		if (x_max >= 1) {
			setDom(y, setMin, (z_min + x_max - 1) / x_max, x.getMaxLit(), z.getMinLit());
		}

		// y <= floor(z.max / x.min)
		if (x_min >= 1) {
			setDom(y, setMax, z_max / x_min, x.getMinLit(), z.getMaxLit());
		}

		return true;
	}